

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::setDynamicDepthStencilState
          (DepthBiasBaseCase *this,float minDepthBounds,float maxDepthBounds,
          deUint32 stencilFrontCompareMask,deUint32 stencilFrontWriteMask,
          deUint32 stencilFrontReference,deUint32 stencilBackCompareMask,
          deUint32 stencilBackWriteMask,deUint32 stencilBackReference)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  
  (*this->m_vk->_vptr_DeviceInterface[0x52])
            (0xbf800000,0x3f800000,this->m_vk,
             (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             CONCAT44(in_register_00000014,stencilFrontWriteMask),
             CONCAT44(in_register_0000000c,stencilFrontReference));
  (*this->m_vk->_vptr_DeviceInterface[0x53])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             0xffffffff);
  (*this->m_vk->_vptr_DeviceInterface[0x54])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             0xffffffff);
  (*this->m_vk->_vptr_DeviceInterface[0x55])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,0
            );
  (*this->m_vk->_vptr_DeviceInterface[0x53])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             0xffffffff);
  (*this->m_vk->_vptr_DeviceInterface[0x54])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,
             0xffffffff);
  (*this->m_vk->_vptr_DeviceInterface[0x55])
            (this->m_vk,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,2,0
            );
  return;
}

Assistant:

void setDynamicDepthStencilState (const float minDepthBounds = -1.0f, const float maxDepthBounds = 1.0f,
		const deUint32 stencilFrontCompareMask = 0xffffffffu, const deUint32 stencilFrontWriteMask = 0xffffffffu,
		const deUint32 stencilFrontReference = 0, const deUint32 stencilBackCompareMask = 0xffffffffu,
		const deUint32 stencilBackWriteMask = 0xffffffffu, const deUint32 stencilBackReference = 0)
	{
		m_vk.cmdSetDepthBounds(*m_cmdBuffer, minDepthBounds, maxDepthBounds);
		m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontCompareMask);
		m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontWriteMask);
		m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_FRONT_BIT, stencilFrontReference);
		m_vk.cmdSetStencilCompareMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackCompareMask);
		m_vk.cmdSetStencilWriteMask(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackWriteMask);
		m_vk.cmdSetStencilReference(*m_cmdBuffer, vk::VK_STENCIL_FACE_BACK_BIT, stencilBackReference);
	}